

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.cpp
# Opt level: O1

int main(void)

{
  pointer *ppiVar1;
  pointer *ppiVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  clock_t cVar7;
  clock_t cVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  size_t i;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  initializer_list<int> __l;
  int v_1;
  vector<int,_std::allocator<int>_> tv;
  vector<int,_std::allocator<int>_> v;
  uint local_ac;
  vector<int,_std::allocator<int>_> local_a8;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong uStack_80;
  long local_78;
  ulong local_70;
  char local_68;
  void *local_58;
  iterator iStack_50;
  int *local_48;
  vector<int,_std::allocator<int>_> local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hamming distance: ",0x12);
  ppiVar1 = &local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppiVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ACCAGGG","");
  ppiVar2 = &local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppiVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ACTATGG","");
  iVar10 = 0;
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0 &&
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    iVar12 = 0;
    iVar10 = 0;
    lVar14 = 0;
    do {
      iVar3 = iVar12 + 1;
      iVar4 = iVar12 + 1;
      if (*(char *)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar14) ==
          *(char *)((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar14)) {
        iVar3 = iVar12;
        iVar4 = iVar10;
      }
      iVar10 = iVar4;
      iVar12 = iVar3;
    } while (((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1 != lVar14) &&
            (bVar15 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + -1 != lVar14, lVar14 = lVar14 + 1,
            bVar15));
  }
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  if ((pointer *)
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != ppiVar2) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != ppiVar1) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_88 = 0x4c00000043;
  uStack_80 = 0x31500000043;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3800000021;
  uStack_90 = 0x2d0000002c;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x300000001;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x4300000005;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,(allocator_type *)&local_58);
  lVar14 = 0;
  do {
    uVar11 = *(int *)((long)&DAT_001030f4 + lVar14) * *(int *)((long)&DAT_001030f4 + lVar14);
    if (5 < uVar11) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    }
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x28);
  cVar7 = clock();
  local_58 = (void *)0x0;
  iStack_50._M_current = (int *)0x0;
  local_48 = (int *)0x0;
  uVar13 = 0;
  do {
    uVar11 = (int)uVar13 * (int)uVar13;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,uVar11);
    if ((uVar11 & 1) != 0 && uVar13 < 50000000) {
      if (iStack_50._M_current == local_48) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                  ((vector<int,std::allocator<int>> *)&local_58,iStack_50,(int *)&local_a8);
      }
      else {
        *iStack_50._M_current = uVar11;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 100000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n------\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Raw: ",5);
  cVar8 = clock();
  poVar6 = std::ostream::_M_insert<double>((double)(cVar8 - cVar7) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------\n",7);
  cVar7 = clock();
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  uStack_90._0_4_ = 50000000;
  local_88 = 0;
  uStack_80 = 100000000;
  local_78 = 1;
  local_70 = 0;
  local_68 = '\0';
  while( true ) {
    uVar9 = local_70;
    uVar13 = uStack_80;
    if (local_68 != '\0') {
      uVar9 = uStack_80;
      uVar13 = local_70;
    }
    if (uVar13 <= uVar9) break;
    uVar13 = local_78 + local_70;
    local_ac = (int)local_70 * (int)local_70;
    local_70 = uVar13;
    if ((local_ac & 1) != 0) {
      if ((int)uStack_90 == 0) {
        if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_ac);
        }
        else {
          *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_ac;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        uStack_90._0_4_ = (int)uStack_90 + -1;
      }
    }
  }
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue-fnc: ",10);
  cVar8 = clock();
  poVar6 = std::ostream::_M_insert<double>((double)(cVar8 - cVar7) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if (local_58 != (void *)0x0) {
    operator_delete(local_58);
  }
  if ((pointer *)
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(void)
{
  std::cout << "Hamming distance: " << hamming("ACCAGGG", "ACTATGG") << std::endl;

  std::vector<int> v = {1,3,5,67,33,56,44,45,67,76,67,789};

  Functions fnc;

  fnc(   from({9,8,7,6,5,4,3,2,1,0})
     ,   map([](int i){ return i*i;})
     ,   filter(_ > 5)
     ,   foreach([](int i){std::cout << i << " ";})
     );
    // std::cout << "------\n";
    // _(   Range(1000)
    //  ,   Filter([](int i) {return (i % 2) == 0;})
    //  ,   Take(20)
    //  ,   Map([](int i){return i+i;})
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   Range()
    //  ,   Zip(From(v))
    //  ,   Zip(Range(100))
    //  ,   ForEach([](std::tuple<int, int, int>&& v){std::cout << std::get<0>(v) << ":" << std::get<1>(v) << ":" << std::get<2>(v) << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   From({A{2000}, A{3}})
    //  ,   Map(&A::value)
    //  ,   Filter([](int i){return i > 10;})
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   From({A{2000}, A{3}})
    //  ,   Map(&A::x)
    //  ,   Filter([](int i){return i > 10;})
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   Range(1000)
    //  ,   Drop(998)
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    //  std::cout << "------\n";
    //  _(   Range(10, 0)
    //   ,   Take(14)
    //   ,   ForEach([](int i){std::cout << i << "\n";})
    //   );
    //
    // std::cout << "------\n";
    // int sum = _(   Range(5)
    //            ,   Reduce(0, [](int a, int b){ return a + b;})
    //            );
    // std::cout << "Sum is: " << sum << "\n";
    // std::cout << "------\n";

    size_t perfCount = 100000000;

    boost::timer tm;

    std::vector<int> tv;
    int c = 0;
    for(size_t i = 0; i < perfCount; ++i)
    {
        int v = i * i;
        if(i < perfCount/2 && v%2)
        {
            tv.emplace_back(v);
        }
        ++c;
    };
    std::cout << "\n------\n";
    std::cout << "Raw: " << tm.elapsed() << "\n";

    std::cout << "------\n";

    tm.restart();

    fnc( range(perfCount)
        , map([](int i) {return i * i;})
        , filter([](int i){ return i % 2;})
        , drop(perfCount/2)
        , into<std::vector<int>>()
        );

    std::cout << "blue-fnc: " << tm.elapsed() << "\n";

    // auto sample = []()
    // {
    //     double x = (double)rand() / RAND_MAX;
    //     double y = (double)rand() / RAND_MAX;
    //     return (x*x + y*y) < 1 ? 1 : 0;
    // };
    //
    // const int numSamples = 1000000;
    // auto count = _( Range(numSamples)
    //               , Map([sample](int){ return sample();})
    //               , Reduce(0, [](int a, int b){ return a + b;})
    //               );
    //
    // std::cout << "Pi: " << 4.0 * (double) count / (double) numSamples << "\n";

    return EXIT_SUCCESS;
}